

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelSizeCase::getMinimumComponentResolution
          (TextureLevelSizeCase *this,GLenum internalFormat)

{
  GLenum GVar1;
  int *piVar2;
  undefined1 local_34 [8];
  IVec4 channelBitDepth;
  TextureFormat format;
  GLenum internalFormat_local;
  TextureLevelSizeCase *this_local;
  
  channelBitDepth.m_data._8_8_ = glu::mapGLInternalFormat(internalFormat);
  tcu::getTextureFormatBitDepth((tcu *)local_34,(TextureFormat *)(channelBitDepth.m_data + 2));
  GVar1 = this->m_pname;
  if (GVar1 == 0x805c) {
    if ((((((channelBitDepth.m_data[2] == 0) || (channelBitDepth.m_data[2] == 5)) ||
          (channelBitDepth.m_data[2] == 7)) ||
         ((channelBitDepth.m_data[2] == 8 || (channelBitDepth.m_data[2] == 0xb)))) ||
        (channelBitDepth.m_data[2] == 9)) ||
       ((channelBitDepth.m_data[2] == 0xe || (channelBitDepth.m_data[2] == 0xf)))) {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_34,0);
      this_local._4_4_ = *piVar2;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (GVar1 == 0x805d) {
    if ((((channelBitDepth.m_data[2] == 5) || (channelBitDepth.m_data[2] == 7)) ||
        (channelBitDepth.m_data[2] == 8)) ||
       (((channelBitDepth.m_data[2] == 0xb || (channelBitDepth.m_data[2] == 9)) ||
        ((channelBitDepth.m_data[2] == 0xe || (channelBitDepth.m_data[2] == 0xf)))))) {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_34,1);
      this_local._4_4_ = *piVar2;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (GVar1 == 0x805e) {
    if (((channelBitDepth.m_data[2] == 7) || (channelBitDepth.m_data[2] == 8)) ||
       ((channelBitDepth.m_data[2] == 0xb ||
        (((channelBitDepth.m_data[2] == 9 || (channelBitDepth.m_data[2] == 0xe)) ||
         (channelBitDepth.m_data[2] == 0xf)))))) {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_34,2);
      this_local._4_4_ = *piVar2;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (GVar1 == 0x805f) {
    if (((channelBitDepth.m_data[2] == 8) || (channelBitDepth.m_data[2] == 0xb)) ||
       ((channelBitDepth.m_data[2] == 9 || (channelBitDepth.m_data[2] == 0xf)))) {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_34,3);
      this_local._4_4_ = *piVar2;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (GVar1 == 0x884a) {
    if ((channelBitDepth.m_data[2] == 0x12) || (channelBitDepth.m_data[2] == 0x14)) {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_34,0);
      this_local._4_4_ = *piVar2;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (GVar1 == 0x88f1) {
    if (channelBitDepth.m_data[2] == 0x14) {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_34,3);
      this_local._4_4_ = *piVar2;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (GVar1 == 0x8c3f) {
    if (internalFormat == 0x8c3d) {
      this_local._4_4_ = 5;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int TextureLevelSizeCase::getMinimumComponentResolution (glw::GLenum internalFormat)
{
	const tcu::TextureFormat	format			= glu::mapGLInternalFormat(internalFormat);
	const tcu::IVec4			channelBitDepth	= tcu::getTextureFormatBitDepth(format);

	switch (m_pname)
	{
		case GL_TEXTURE_RED_SIZE:
			if (format.order == tcu::TextureFormat::R		||
				format.order == tcu::TextureFormat::RG		||
				format.order == tcu::TextureFormat::RGB		||
				format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelBitDepth[0];
			else
				return 0;

		case GL_TEXTURE_GREEN_SIZE:
			if (format.order == tcu::TextureFormat::RG		||
				format.order == tcu::TextureFormat::RGB		||
				format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelBitDepth[1];
			else
				return 0;

		case GL_TEXTURE_BLUE_SIZE:
			if (format.order == tcu::TextureFormat::RGB		||
				format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelBitDepth[2];
			else
				return 0;

		case GL_TEXTURE_ALPHA_SIZE:
			if (format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelBitDepth[3];
			else
				return 0;

		case GL_TEXTURE_DEPTH_SIZE:
			if (format.order == tcu::TextureFormat::D	||
				format.order == tcu::TextureFormat::DS)
				return channelBitDepth[0];
			else
				return 0;

		case GL_TEXTURE_STENCIL_SIZE:
			if (format.order == tcu::TextureFormat::DS)
				return channelBitDepth[3];
			else
				return 0;

		case GL_TEXTURE_SHARED_SIZE:
			if (internalFormat == GL_RGB9_E5)
				return 5;
			else
				return 0;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}